

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::StrongSIVTest
          (LoopDependenceAnalysis *this,SENode *source,SENode *destination,SENode *coefficient,
          DistanceEntry *distance_entry)

{
  int iVar1;
  size_type sVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Loop *loop;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SENode *pSVar3;
  undefined4 extraout_var_03;
  SEConstantNode *pSVar4;
  int64_t iVar5;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  allocator<char> local_381;
  string local_380;
  allocator<char> local_359;
  string local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  int64_t local_2f8;
  int64_t bounds_value;
  SENode *bounds;
  string local_2e0;
  SENode *local_2c0;
  SENode *upper_bound;
  SENode *lower_bound;
  string local_2a8;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  int64_t local_160;
  int64_t coefficient_value;
  int64_t delta_value;
  SEConstantNode *coefficient_constant;
  SEConstantNode *delta_constant;
  int64_t distance;
  SENode *constant_term_delta;
  string local_128;
  SENode *local_108;
  SENode *destination_constant_term;
  SENode *source_constant_term;
  Loop *subscript_loop;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> subscript_pair;
  string local_d8;
  undefined4 local_b8;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  destination_value_unknown_nodes;
  vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
  source_value_unknown_nodes;
  string local_58;
  DistanceEntry *local_38;
  DistanceEntry *distance_entry_local;
  SENode *coefficient_local;
  SENode *destination_local;
  SENode *source_local;
  LoopDependenceAnalysis *this_local;
  
  local_38 = distance_entry;
  distance_entry_local = (DistanceEntry *)coefficient;
  coefficient_local = destination;
  destination_local = source;
  source_local = (SENode *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Performing StrongSIVTest.",
             (allocator<char> *)
             ((long)&source_value_unknown_nodes.
                     super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  PrintDebug(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&source_value_unknown_nodes.
                     super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  SENode::CollectValueUnknownNodes
            ((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
              *)&destination_value_unknown_nodes.
                 super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,destination_local);
  SENode::CollectValueUnknownNodes
            ((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
              *)local_90,coefficient_local);
  sVar2 = std::
          vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
          ::size((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                  *)&destination_value_unknown_nodes.
                     super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((sVar2 == 0) &&
     (sVar2 = std::
              vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
              ::size((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
                      *)local_90), sVar2 == 0)) {
    iVar1 = (*destination_local->_vptr_SENode[6])();
    if ((CONCAT44(extraout_var,iVar1) == 0) ||
       (iVar1 = (*coefficient_local->_vptr_SENode[6])(), CONCAT44(extraout_var_00,iVar1) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "StrongSIVTest could not simplify source and destination to SERecurrentNodes so will exit."
                 ,(allocator<char> *)((long)&subscript_pair.second + 7));
      PrintDebug(this,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&subscript_pair.second + 7));
      local_38->direction = ALL;
      this_local._7_1_ = false;
    }
    else {
      _subscript_loop =
           std::make_pair<spvtools::opt::SENode*&,spvtools::opt::SENode*&>
                     (&destination_local,&coefficient_local);
      loop = GetLoopForSubscriptPair
                       (this,(pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *)
                             &subscript_loop);
      source_constant_term = (SENode *)loop;
      iVar1 = (*destination_local->_vptr_SENode[6])();
      destination_constant_term =
           GetConstantTerm(this,loop,(SERecurrentNode *)CONCAT44(extraout_var_01,iVar1));
      pSVar3 = source_constant_term;
      iVar1 = (*coefficient_local->_vptr_SENode[6])();
      local_108 = GetConstantTerm(this,(Loop *)pSVar3,
                                  (SERecurrentNode *)CONCAT44(extraout_var_02,iVar1));
      if ((destination_constant_term == (SENode *)0x0) || (local_108 == (SENode *)0x0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,
                   "StrongSIVTest could not collect the constant terms of either source or destination so will exit."
                   ,(allocator<char> *)((long)&constant_term_delta + 7));
        PrintDebug(this,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)((long)&constant_term_delta + 7));
        this_local._7_1_ = false;
      }
      else {
        pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction
                           (&this->scalar_evolution_,local_108,destination_constant_term);
        distance = (int64_t)ScalarEvolutionAnalysis::SimplifyExpression
                                      (&this->scalar_evolution_,pSVar3);
        delta_constant = (SEConstantNode *)0x0;
        iVar1 = (*((SENode *)distance)->_vptr_SENode[4])();
        coefficient_constant = (SEConstantNode *)CONCAT44(extraout_var_03,iVar1);
        delta_value = (**(code **)(*(long *)distance_entry_local + 0x20))();
        if ((coefficient_constant == (SEConstantNode *)0x0) || (delta_value == 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"StrongSIVTest could not produce a distance. Must exit.",
                     (allocator<char> *)((long)&lower_bound + 7));
          PrintDebug(this,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&lower_bound + 7));
          local_38->distance = 7;
          this_local._7_1_ = false;
        }
        else {
          coefficient_value = SEConstantNode::FoldToSingleValue(coefficient_constant);
          local_160 = SEConstantNode::FoldToSingleValue((SEConstantNode *)delta_value);
          ToString<long>(&local_200,this,coefficient_value);
          std::operator+(&local_1e0,
                         "StrongSIVTest found delta value and coefficient value as constants with values:\n\tdelta value: "
                         ,&local_200);
          std::operator+(&local_1c0,&local_1e0,"\n\tcoefficient value: ");
          ToString<long>(&local_220,this,local_160);
          std::operator+(&local_1a0,&local_1c0,&local_220);
          std::operator+(&local_180,&local_1a0,"\n");
          PrintDebug(this,&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_200);
          if (coefficient_value % local_160 == 0) {
            delta_constant = (SEConstantNode *)(coefficient_value / local_160);
            ToString<long>(&local_288,this,(long)delta_constant);
            std::operator+(&local_268,"StrongSIV test found distance as ",&local_288);
            PrintDebug(this,&local_268);
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_288);
            upper_bound = GetLowerBound(this,(Loop *)source_constant_term);
            local_2c0 = GetUpperBound(this,(Loop *)source_constant_term);
            if ((upper_bound == (SENode *)0x0) || (local_2c0 == (SENode *)0x0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_380,
                         "StrongSIVTest was unable to gather lower and upper bounds.",&local_381);
              PrintDebug(this,&local_380);
              std::__cxx11::string::~string((string *)&local_380);
              std::allocator<char>::~allocator(&local_381);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2e0,"StrongSIVTest found bounds.",
                         (allocator<char> *)((long)&bounds + 7));
              PrintDebug(this,&local_2e0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&bounds + 7));
              pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction
                                 (&this->scalar_evolution_,local_2c0,upper_bound);
              bounds_value = (int64_t)ScalarEvolutionAnalysis::SimplifyExpression
                                                (&this->scalar_evolution_,pSVar3);
              iVar1 = (**((SENode *)bounds_value)->_vptr_SENode)();
              if (iVar1 == 0) {
                pSVar4 = (SEConstantNode *)(**(code **)(*(long *)bounds_value + 0x20))();
                local_2f8 = SEConstantNode::FoldToSingleValue(pSVar4);
                ToString<long>(&local_338,this,local_2f8);
                std::operator+(&local_318,
                               "StrongSIVTest found upper_bound - lower_bound as a constant with value "
                               ,&local_338);
                PrintDebug(this,&local_318);
                std::__cxx11::string::~string((string *)&local_318);
                std::__cxx11::string::~string((string *)&local_338);
                pSVar4 = delta_constant;
                if ((long)delta_constant < 1) {
                  pSVar4 = (SEConstantNode *)-(long)delta_constant;
                }
                iVar5 = local_2f8;
                if (local_2f8 < 1) {
                  iVar5 = -local_2f8;
                }
                if (iVar5 < (long)pSVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_358,
                             "StrongSIVTest proved independence through distance escaping the loop bounds."
                             ,&local_359);
                  PrintDebug(this,&local_358);
                  std::__cxx11::string::~string((string *)&local_358);
                  std::allocator<char>::~allocator(&local_359);
                  local_38->dependence_information = DISTANCE;
                  local_38->direction = NONE;
                  local_38->distance = (int64_t)delta_constant;
                  this_local._7_1_ = true;
                  goto LAB_00a42a57;
                }
              }
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a8,
                       "StrongSIVTest could not prove independence. Gathering direction information."
                       ,&local_3a9);
            PrintDebug(this,&local_3a8);
            std::__cxx11::string::~string((string *)&local_3a8);
            std::allocator<char>::~allocator(&local_3a9);
            if ((long)delta_constant < 1) {
              if (delta_constant == (SEConstantNode *)0x0) {
                local_38->dependence_information = DISTANCE;
                local_38->direction = EQ;
                local_38->distance = 0;
                this_local._7_1_ = false;
              }
              else if ((long)delta_constant < 0) {
                local_38->dependence_information = DISTANCE;
                local_38->direction = GT;
                local_38->distance = (int64_t)delta_constant;
                this_local._7_1_ = false;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3d0,
                           "StrongSIVTest was unable to determine any dependence information.",
                           &local_3d1);
                PrintDebug(this,&local_3d0);
                std::__cxx11::string::~string((string *)&local_3d0);
                std::allocator<char>::~allocator(&local_3d1);
                local_38->direction = ALL;
                this_local._7_1_ = false;
              }
            }
            else {
              local_38->dependence_information = DISTANCE;
              local_38->direction = LT;
              local_38->distance = (int64_t)delta_constant;
              this_local._7_1_ = false;
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_240,
                       "StrongSIVTest proved independence through distance not being an integer.",
                       &local_241);
            PrintDebug(this,&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            std::allocator<char>::~allocator(&local_241);
            local_38->dependence_information = DIRECTION;
            local_38->direction = NONE;
            this_local._7_1_ = true;
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "StrongSIVTest found symbolics. Will attempt SymbolicStrongSIVTest.",&local_b1);
    PrintDebug(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    this_local._7_1_ =
         SymbolicStrongSIVTest
                   (this,destination_local,coefficient_local,(SENode *)distance_entry_local,local_38
                   );
  }
LAB_00a42a57:
  local_b8 = 1;
  std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
  ~vector((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
           *)local_90);
  std::vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>::
  ~vector((vector<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
           *)&destination_value_unknown_nodes.
              super__Vector_base<spvtools::opt::SEValueUnknown_*,_std::allocator<spvtools::opt::SEValueUnknown_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LoopDependenceAnalysis::StrongSIVTest(SENode* source, SENode* destination,
                                           SENode* coefficient,
                                           DistanceEntry* distance_entry) {
  PrintDebug("Performing StrongSIVTest.");
  // If both source and destination are SERecurrentNodes we can perform tests
  // based on distance.
  // If either source or destination contain value unknown nodes or if one or
  // both are not SERecurrentNodes we must attempt a symbolic test.
  std::vector<SEValueUnknown*> source_value_unknown_nodes =
      source->CollectValueUnknownNodes();
  std::vector<SEValueUnknown*> destination_value_unknown_nodes =
      destination->CollectValueUnknownNodes();
  if (source_value_unknown_nodes.size() > 0 ||
      destination_value_unknown_nodes.size() > 0) {
    PrintDebug(
        "StrongSIVTest found symbolics. Will attempt SymbolicStrongSIVTest.");
    return SymbolicStrongSIVTest(source, destination, coefficient,
                                 distance_entry);
  }

  if (!source->AsSERecurrentNode() || !destination->AsSERecurrentNode()) {
    PrintDebug(
        "StrongSIVTest could not simplify source and destination to "
        "SERecurrentNodes so will exit.");
    distance_entry->direction = DistanceEntry::Directions::ALL;
    return false;
  }

  // Build an SENode for distance.
  std::pair<SENode*, SENode*> subscript_pair =
      std::make_pair(source, destination);
  const Loop* subscript_loop = GetLoopForSubscriptPair(subscript_pair);
  SENode* source_constant_term =
      GetConstantTerm(subscript_loop, source->AsSERecurrentNode());
  SENode* destination_constant_term =
      GetConstantTerm(subscript_loop, destination->AsSERecurrentNode());
  if (!source_constant_term || !destination_constant_term) {
    PrintDebug(
        "StrongSIVTest could not collect the constant terms of either source "
        "or destination so will exit.");
    return false;
  }
  SENode* constant_term_delta =
      scalar_evolution_.SimplifyExpression(scalar_evolution_.CreateSubtraction(
          destination_constant_term, source_constant_term));

  // Scalar evolution doesn't perform division, so we must fold to constants and
  // do it manually.
  // We must check the offset delta and coefficient are constants.
  int64_t distance = 0;
  SEConstantNode* delta_constant = constant_term_delta->AsSEConstantNode();
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (delta_constant && coefficient_constant) {
    int64_t delta_value = delta_constant->FoldToSingleValue();
    int64_t coefficient_value = coefficient_constant->FoldToSingleValue();
    PrintDebug(
        "StrongSIVTest found delta value and coefficient value as constants "
        "with values:\n"
        "\tdelta value: " +
        ToString(delta_value) +
        "\n\tcoefficient value: " + ToString(coefficient_value) + "\n");
    // Check if the distance is not integral to try to prove independence.
    if (delta_value % coefficient_value != 0) {
      PrintDebug(
          "StrongSIVTest proved independence through distance not being an "
          "integer.");
      distance_entry->dependence_information =
          DistanceEntry::DependenceInformation::DIRECTION;
      distance_entry->direction = DistanceEntry::Directions::NONE;
      return true;
    } else {
      distance = delta_value / coefficient_value;
      PrintDebug("StrongSIV test found distance as " + ToString(distance));
    }
  } else {
    // If we can't fold delta and coefficient to single values we can't produce
    // distance.
    // As a result we can't perform the rest of the pass and must assume
    // dependence in all directions.
    PrintDebug("StrongSIVTest could not produce a distance. Must exit.");
    distance_entry->distance = DistanceEntry::Directions::ALL;
    return false;
  }

  // Next we gather the upper and lower bounds as constants if possible. If
  // distance > upper_bound - lower_bound we prove independence.
  SENode* lower_bound = GetLowerBound(subscript_loop);
  SENode* upper_bound = GetUpperBound(subscript_loop);
  if (lower_bound && upper_bound) {
    PrintDebug("StrongSIVTest found bounds.");
    SENode* bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(upper_bound, lower_bound));

    if (bounds->GetType() == SENode::SENodeType::Constant) {
      int64_t bounds_value = bounds->AsSEConstantNode()->FoldToSingleValue();
      PrintDebug(
          "StrongSIVTest found upper_bound - lower_bound as a constant with "
          "value " +
          ToString(bounds_value));

      // If the absolute value of the distance is > upper bound - lower bound
      // then we prove independence.
      if (llabs(distance) > llabs(bounds_value)) {
        PrintDebug(
            "StrongSIVTest proved independence through distance escaping the "
            "loop bounds.");
        distance_entry->dependence_information =
            DistanceEntry::DependenceInformation::DISTANCE;
        distance_entry->direction = DistanceEntry::Directions::NONE;
        distance_entry->distance = distance;
        return true;
      }
    }
  } else {
    PrintDebug("StrongSIVTest was unable to gather lower and upper bounds.");
  }

  // Otherwise we can get a direction as follows
  //             { < if distance > 0
  // direction = { = if distance == 0
  //             { > if distance < 0
  PrintDebug(
      "StrongSIVTest could not prove independence. Gathering direction "
      "information.");
  if (distance > 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::LT;
    distance_entry->distance = distance;
    return false;
  }
  if (distance == 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::EQ;
    distance_entry->distance = 0;
    return false;
  }
  if (distance < 0) {
    distance_entry->dependence_information =
        DistanceEntry::DependenceInformation::DISTANCE;
    distance_entry->direction = DistanceEntry::Directions::GT;
    distance_entry->distance = distance;
    return false;
  }

  // We were unable to prove independence or discern any additional information
  // Must assume <=> direction.
  PrintDebug(
      "StrongSIVTest was unable to determine any dependence information.");
  distance_entry->direction = DistanceEntry::Directions::ALL;
  return false;
}